

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.h
# Opt level: O2

void GD::vec_add_multipredict<sparse_parameters>
               (multipredict_info<sparse_parameters> *mp,float fx,uint64_t fi)

{
  ulong uVar1;
  ulong uVar2;
  weight *pwVar3;
  ulong i;
  size_t c;
  ulong uVar4;
  polyprediction *ppVar5;
  
  if (1e-10 <= ABS(fx)) {
    uVar1 = mp->weights->_weight_mask;
    uVar2 = mp->count;
    ppVar5 = mp->pred;
    i = fi & uVar1;
    uVar4 = (uVar2 - 1) * mp->step + i;
    if (uVar1 < uVar4) {
      for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
        pwVar3 = sparse_parameters::operator[](mp->weights,i & uVar1);
        ppVar5->scalar = *pwVar3 * fx + ppVar5->scalar;
        i = (i & uVar1) + mp->step;
        ppVar5 = ppVar5 + 1;
        uVar2 = mp->count;
      }
    }
    else {
      for (; i <= uVar4; i = i + mp->step) {
        pwVar3 = sparse_parameters::operator[](mp->weights,i);
        ppVar5->scalar = *pwVar3 * fx + ppVar5->scalar;
        ppVar5 = ppVar5 + 1;
      }
    }
  }
  return;
}

Assistant:

inline void vec_add_multipredict(multipredict_info<T>& mp, const float fx, uint64_t fi)
{
  if ((-1e-10 < fx) && (fx < 1e-10))
    return;
  uint64_t mask = mp.weights.mask();
  polyprediction* p = mp.pred;
  fi &= mask;
  uint64_t top = fi + (uint64_t)((mp.count - 1) * mp.step);
  uint64_t i = 0;
  if (top <= mask)
  {
    i += fi;
    for (; i <= top; i += mp.step, ++p)
      p->scalar +=
          fx * mp.weights[i];  // TODO: figure out how to use weight_parameters::iterator (not using change_begin())
  }
  else  // TODO: this could be faster by unrolling into two loops
    for (size_t c = 0; c < mp.count; ++c, fi += (uint64_t)mp.step, ++p)
    {
      fi &= mask;
      p->scalar += fx * mp.weights[fi];
    }
}